

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  int y;
  long lVar10;
  long lVar11;
  char *pcVar12;
  ushort *puVar13;
  undefined1 uVar14;
  ushort *__ptr;
  float fVar15;
  double dVar16;
  uint8_t (*rgb) [60] [80] [3];
  SDL_Event e;
  uint16_t y16 [60] [80];
  long local_2638;
  float local_262c;
  uint local_2628;
  uint local_2624;
  undefined8 local_2620;
  long local_2618;
  long local_2610;
  FILE *local_2608;
  long local_2600;
  size_t local_25f8;
  int local_25f0 [5];
  int local_25dc;
  int local_25d8;
  ushort local_25b8 [4804];
  
  if (argc - 5U < 0xfffffffd) {
    printf("Displays frames in file created by pt1cap\n\nUsage: %s <filename> [blue_level red_level]\n\n"
           ,*argv);
    iVar3 = -1;
  }
  else {
    printf("%i\n",argc);
    if (argc < 4) {
      lVar6 = -0xd48;
      local_262c = 0.51;
    }
    else {
      lVar6 = atol(argv[2]);
      lVar6 = -lVar6;
      dVar16 = atof(argv[3]);
      local_262c = (float)(255.0 / ((double)lVar6 + dVar16));
      printf("%li %f\n",(double)local_262c,lVar6);
    }
    local_2608 = fopen(argv[1],"r");
    puts(argv[1]);
    iVar3 = SDL_Init(0x20);
    if (iVar3 < 0) {
      uVar9 = SDL_GetError();
      pcVar12 = "Couldn\'t initialize SDL: %s";
    }
    else {
      lVar7 = SDL_CreateWindow("Bat Drone Ground Station",0x1fff0000,0x1fff0000,0x280,0x1e0,0x20);
      if (lVar7 == 0) {
        uVar9 = SDL_GetError();
        pcVar12 = "Couldn\'t create window: %s";
      }
      else {
        SDL_DisableScreenSaver();
        lVar8 = SDL_CreateRenderer(lVar7,0xffffffff,0);
        if (lVar8 == 0) {
          uVar9 = SDL_GetError();
          pcVar12 = "Couldn\'t create renderer: %s";
        }
        else {
          local_2610 = SDL_CreateTexture(lVar8,0x17101803,1,0x50,0x3c);
          if (local_2610 != 0) {
            bVar2 = false;
            local_2624 = 0;
            local_2620 = 0;
            local_2618 = lVar8;
            local_2600 = lVar7;
            do {
              __ptr = local_25b8;
              uVar4 = SDL_GetTicks();
              if (bVar2 || (int)local_2620 != 0) {
LAB_0010162c:
                iVar3 = SDL_PollEvent(local_25f0);
                if (iVar3 == 0) {
                  bVar1 = false;
                }
                else {
                  bVar1 = true;
                  do {
                    if (local_25f0[0] == 0x402) {
                      iVar3 = local_25dc + 7;
                      if (-1 < local_25dc) {
                        iVar3 = local_25dc;
                      }
                      iVar5 = local_25d8 + 7;
                      if (-1 < local_25d8) {
                        iVar5 = local_25d8;
                      }
                      printf("frame %i\ncoord %i,%i\nintensity %u\n",(ulong)local_2624,
                             (long)(iVar3 >> 3),(long)(iVar5 >> 3),
                             (ulong)local_25b8[(long)(iVar5 >> 3) * 0x50 + (long)(iVar3 >> 3)]);
                    }
                    else if (local_25f0[0] == 0x300) {
                      bVar2 = !bVar2;
                    }
                    else if (local_25f0[0] == 0x100) {
                      bVar1 = false;
                    }
                    iVar3 = SDL_PollEvent(local_25f0);
                  } while (iVar3 != 0);
                  bVar1 = !bVar1;
                }
              }
              else {
                local_2628 = uVar4;
                local_25f8 = fread(__ptr,0x2580,1,local_2608);
                if (local_25f8 == 0) {
                  puts("End of file");
                  local_2620 = 1;
                }
                else {
                  local_2628 = local_2628 + 0x28;
                  SDL_LockTexture(local_2610,0,&local_2638,local_25f0);
                  lVar7 = local_2610;
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar11 = 0;
                    puVar13 = __ptr;
                    do {
                      fVar15 = (float)(long)((ulong)*puVar13 + lVar6) * local_262c;
                      if (fVar15 <= 255.0) {
                        if (0.0 <= fVar15) {
                          uVar14 = (undefined1)(int)fVar15;
                          *(undefined1 *)(lVar11 + 2 + local_2638 + lVar8) = uVar14;
                          *(undefined1 *)(lVar11 + 1 + local_2638 + lVar8) = uVar14;
                          *(undefined1 *)(lVar11 + local_2638 + lVar8) = uVar14;
                        }
                        else {
                          *(undefined1 *)(lVar11 + local_2638 + lVar8) = 0;
                          *(undefined1 *)(lVar11 + 1 + local_2638 + lVar8) = 0;
                          *(undefined1 *)(lVar11 + 2 + local_2638 + lVar8) = 0xff;
                        }
                      }
                      else {
                        *(undefined1 *)(lVar11 + local_2638 + lVar8) = 0xff;
                        *(undefined1 *)(lVar11 + 1 + local_2638 + lVar8) = 0;
                        *(undefined1 *)(lVar11 + 2 + local_2638 + lVar8) = 0;
                      }
                      puVar13 = puVar13 + 1;
                      lVar11 = lVar11 + 3;
                    } while (lVar11 != 0xf0);
                    lVar10 = lVar10 + 1;
                    __ptr = __ptr + 0x50;
                    lVar8 = lVar8 + 0xf0;
                  } while (lVar10 != 0x3c);
                  SDL_UnlockTexture(local_2610);
                  lVar8 = local_2618;
                  SDL_SetRenderDrawColor(local_2618,0xff,0xff,0xff,0xff);
                  SDL_RenderClear(lVar8);
                  local_2620 = 0;
                  SDL_RenderCopy(lVar8,lVar7,0,0);
                  SDL_RenderPresent(lVar8);
                  uVar4 = SDL_GetTicks();
                  if (uVar4 < local_2628) {
                    SDL_Delay();
                  }
                }
                local_2624 = local_2624 + 1;
                if (local_25f8 != 0) goto LAB_0010162c;
                bVar1 = false;
                bVar2 = false;
              }
              if (bVar1) {
                fclose(local_2608);
                SDL_DestroyRenderer(local_2618);
                SDL_DestroyWindow(local_2600);
                SDL_Quit();
                return 0;
              }
            } while( true );
          }
          uVar9 = SDL_GetError();
          pcVar12 = "Couldn\'t create texture: %s";
        }
      }
    }
    SDL_LogError(0,pcVar12,uVar9);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc > 4 || argc < 2) {
    printf(
      "Displays frames in file created by pt1cap\n"\
      "\n"\
      "Usage: %s <filename> [blue_level red_level]\n"\
      "\n"\
    , argv[0]);
    return -1;
  }
  int paused = 0;
  int frame = 0;
  int end = 0;
  int run = 1;
  long offset;
  float scale;
  printf("%i\n", argc);
  if(argc > 3) {
    offset = -atol(argv[2]);
    scale = 255.0 / (atof(argv[3]) + offset);
    printf("%li %f\n", offset, scale);
  } else {
    // 3400 to 3900 is human
    offset = -3400; // to 3800
    scale = 255.0/(3900-3400);
  }

  FILE *fd = fopen(argv[1], "r");
  printf("%s\n", argv[1]);

  SDL_Window *window;
  SDL_Renderer *renderer;
  SDL_Texture *texture;


  if (SDL_Init(SDL_INIT_VIDEO) < 0) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s", SDL_GetError());
    return 3;
  }
  if (!(window = SDL_CreateWindow("Bat Drone Ground Station", SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED, 640, 480, SDL_WINDOW_RESIZABLE))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create window: %s", SDL_GetError());
    return 3;
  }
  SDL_DisableScreenSaver();
  if (!(renderer = SDL_CreateRenderer(window, -1, 0))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create renderer: %s", SDL_GetError());
    return 3;
  }
  if (!(texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_RGB24, SDL_TEXTUREACCESS_STREAMING, 80, 60))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create texture: %s", SDL_GetError());
    return 3;
  }

  const int w = 80;
  const int h = 60;
  const int r = 0;
  const int g = 1;
  const int b = 2;
  while(run) {
    unsigned long next_ticks = SDL_GetTicks() + 40;
    uint16_t y16[60][80];
    uint8_t (*rgb)[60][80][3];
    if(!paused && !end) {
      frame++;
      int pitch;
      if(!fread((void *) &y16, sizeof(y16), 1, fd)) {
        printf("End of file\n");
        end = 1;
        continue;
      }
      SDL_LockTexture(texture, NULL, (void **) &rgb, &pitch);
      for (int y = 0; y < h; y++) {
        for (int x = 0; x < w; x++) {
          float pixel = ((float) (y16[y][x] + offset)) * scale;
          if (pixel > 0xFF) {
            (*rgb)[y][x][r] = 0xFF;
            (*rgb)[y][x][g] = 0;
            (*rgb)[y][x][b] = 0;
          } else if (pixel < 0) {
            (*rgb)[y][x][r] = 0;
            (*rgb)[y][x][g] = 0;
            (*rgb)[y][x][b] = 0xFF;
          } else {
            (*rgb)[y][x][r] = (*rgb)[y][x][g] = (*rgb)[y][x][b] = pixel;
          }
        }
      }
      SDL_UnlockTexture(texture);
      SDL_SetRenderDrawColor(renderer, 255, 255, 255, 255);
      SDL_RenderClear(renderer);
      SDL_RenderCopy(renderer, texture, NULL, NULL);
      SDL_RenderPresent(renderer);
      unsigned long ticks = SDL_GetTicks();
      if (ticks < next_ticks) {
        SDL_Delay(next_ticks - ticks);
      }
    }
    SDL_Event e;
    while(SDL_PollEvent(&e)) {
      int x, y;
      switch(e.type) {
      case SDL_QUIT:
        run = 0;
        break;
      case SDL_KEYDOWN:
        paused = !paused;
        break;
      case SDL_MOUSEBUTTONUP:
        x = e.button.x * 80 / 640;
        y = e.button.y * 60 / 480;
        printf("frame %i\ncoord %i,%i\nintensity %u\n", frame, x, y, y16[y][x]);
      }
    }
  }
  fclose(fd);

  SDL_DestroyRenderer(renderer);
  SDL_DestroyWindow(window);
  SDL_Quit();
  return 0;
}